

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argon2.c
# Opt level: O1

void argon2(Argon2Flavour flavour,uint32_t mem,uint32_t passes,uint32_t parallel,uint32_t taglen,
           ptrlen P,ptrlen S,ptrlen K,ptrlen X,strbuf *out)

{
  ulong uVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  uint uVar5;
  bool bVar6;
  void *vout;
  ssh_hash *psVar7;
  void *__s;
  uint *puVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  void *pvVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  int iVar19;
  uint uVar20;
  size_t factor1;
  bool bVar21;
  uint8_t h0 [64];
  blk out2i;
  blk tmp2i;
  ulong local_11d0;
  ulong local_11b8;
  long local_11b0;
  uchar local_1078 [72];
  uint8_t local_1030;
  undefined1 local_102f;
  undefined1 local_102e;
  undefined1 local_102d;
  undefined1 local_102c;
  undefined1 local_102b;
  undefined1 local_102a;
  undefined1 local_1029;
  undefined1 local_1028;
  undefined1 local_1027;
  undefined1 local_1026;
  undefined1 local_1025;
  undefined1 local_1024;
  undefined1 local_1023;
  undefined1 local_1022;
  undefined1 local_1021;
  undefined1 local_1020;
  undefined4 local_101f;
  undefined3 uStack_101b;
  undefined1 local_1018;
  undefined1 local_1017;
  undefined1 local_1016;
  undefined1 local_1015;
  undefined1 local_1014;
  undefined1 local_1013;
  undefined1 local_1012;
  undefined1 local_1011;
  undefined1 local_1010;
  undefined1 local_100f;
  undefined1 local_100e;
  undefined1 local_100d;
  undefined4 local_100c;
  undefined1 local_1008;
  undefined1 local_1007;
  undefined1 local_1006;
  undefined1 local_1005;
  undefined4 local_1004;
  undefined1 local_1000;
  undefined1 local_fff;
  undefined1 local_ffe;
  undefined1 local_ffd;
  undefined1 local_ffc;
  undefined1 local_ffb;
  undefined1 local_ffa;
  undefined1 local_ff9;
  Argon2Flavour local_c30 [256];
  uint8_t local_830 [1024];
  uint8_t local_430 [1024];
  
  vout = strbuf_append(out,(ulong)taglen);
  psVar7 = blake2b_new_general(0x40);
  uVar17 = (ulong)parallel;
  local_c30[0] = parallel;
  (*psVar7->binarysink_->write)(psVar7->binarysink_,local_c30,4);
  local_c30[0] = taglen;
  (*psVar7->binarysink_->write)(psVar7->binarysink_,local_c30,4);
  local_c30[0] = mem;
  (*psVar7->binarysink_->write)(psVar7->binarysink_,local_c30,4);
  local_c30[0] = passes;
  (*psVar7->binarysink_->write)(psVar7->binarysink_,local_c30,4);
  local_c30[0] = 0x13;
  (*psVar7->binarysink_->write)(psVar7->binarysink_,local_c30,4);
  local_c30[0] = flavour;
  (*psVar7->binarysink_->write)(psVar7->binarysink_,local_c30,4);
  BinarySink_put_stringpl_le(psVar7->binarysink_,P);
  BinarySink_put_stringpl_le(psVar7->binarysink_,S);
  BinarySink_put_stringpl_le(psVar7->binarysink_,K);
  BinarySink_put_stringpl_le(psVar7->binarysink_,X);
  (*psVar7->vt->digest)(psVar7,local_1078);
  (*psVar7->vt->free)(psVar7);
  uVar2 = (ulong)mem / (ulong)(parallel * 4);
  uVar1 = uVar2 * 4;
  factor1 = uVar1 * uVar17;
  __s = safemalloc(factor1,0x400,0);
  memset(__s,0,factor1 * 0x400);
  if (parallel != 0) {
    uVar13 = 0;
    pvVar15 = __s;
    do {
      psVar7 = blake2b_new_general(0x40);
      local_c30[0] = 0x400;
      (*psVar7->binarysink_->write)(psVar7->binarysink_,local_c30,4);
      BinarySink_put_data(psVar7->binarysink_,local_1078,0x40);
      local_c30[0] = Argon2d;
      (*psVar7->binarysink_->write)(psVar7->binarysink_,local_c30,4);
      local_c30[0] = (Argon2Flavour)uVar13;
      (*psVar7->binarysink_->write)(psVar7->binarysink_,local_c30,4);
      hprime_final(psVar7,0x400,pvVar15);
      uVar13 = uVar13 + 1;
      pvVar15 = (void *)((long)pvVar15 + 0x400);
    } while (uVar17 != uVar13);
  }
  if (parallel != 0) {
    pvVar15 = (void *)(uVar17 * 0x400 + (long)__s);
    uVar13 = 0;
    do {
      psVar7 = blake2b_new_general(0x40);
      local_c30[0] = 0x400;
      (*psVar7->binarysink_->write)(psVar7->binarysink_,local_c30,4);
      BinarySink_put_data(psVar7->binarysink_,local_1078,0x40);
      local_c30[0] = Argon2i;
      (*psVar7->binarysink_->write)(psVar7->binarysink_,local_c30,4);
      local_c30[0] = (Argon2Flavour)uVar13;
      (*psVar7->binarysink_->write)(psVar7->binarysink_,local_c30,4);
      hprime_final(psVar7,0x400,pvVar15);
      uVar13 = uVar13 + 1;
      pvVar15 = (void *)((long)pvVar15 + 0x400);
    } while (uVar17 != uVar13);
  }
  if (passes != 0) {
    bVar21 = flavour == Argon2d;
    local_11b8 = 2;
    uVar13 = 0;
    do {
      local_11b0 = 0;
      bVar6 = bVar21;
      do {
        bVar21 = bVar6;
        if (local_11b0 == 2) {
          bVar21 = true;
        }
        if (flavour != Argon2id) {
          bVar21 = bVar6;
        }
        if (uVar13 != 0) {
          bVar21 = bVar6;
        }
        if (parallel != 0) {
          uVar10 = local_11b0 * uVar2;
          uVar5 = ((int)local_11b0 + 1U & 3) * (int)uVar2;
          if (uVar13 == 0) {
            uVar5 = 0;
          }
          local_11d0 = 0;
          do {
            if (local_11b8 < uVar2) {
              lVar14 = 0;
              uVar18 = local_11b8;
              do {
                lVar16 = uVar18 + uVar10;
                iVar19 = (int)uVar1;
                if (lVar16 != 0) {
                  iVar19 = (int)lVar16;
                }
                uVar20 = iVar19 - 1;
                if (bVar21) {
                  puVar8 = (uint *)((long)__s +
                                   (ulong)(uVar20 * parallel) * 0x400 + local_11d0 * 0x400);
                }
                else {
                  if (lVar14 == 0 || (uVar18 & 0x7f) == 0) {
                    memset(&local_1030,0,0x400);
                    local_1030 = (uint8_t)uVar13;
                    local_102d = (undefined1)(uVar13 >> 0x18);
                    local_102c = (undefined1)(uVar13 >> 0x20);
                    local_102b = (undefined1)(uVar13 >> 0x28);
                    local_102a = (undefined1)(uVar13 >> 0x30);
                    local_1029 = (undefined1)(uVar13 >> 0x38);
                    local_1028 = (undefined1)local_11d0;
                    local_1025 = (undefined1)(local_11d0 >> 0x18);
                    local_1024 = (undefined1)(local_11d0 >> 0x20);
                    local_1023 = (undefined1)(local_11d0 >> 0x28);
                    local_1022 = (undefined1)(local_11d0 >> 0x30);
                    local_1021 = (undefined1)(local_11d0 >> 0x38);
                    local_1020 = (undefined1)local_11b0;
                    uStack_101b = 0;
                    local_101f = 0;
                    local_1018 = (undefined1)factor1;
                    local_1015 = (undefined1)(factor1 >> 0x18);
                    local_1014 = (undefined1)(factor1 >> 0x20);
                    local_1013 = (undefined1)(factor1 >> 0x28);
                    local_1012 = (undefined1)(factor1 >> 0x30);
                    local_1011 = (undefined1)(factor1 >> 0x38);
                    local_1010 = (undefined1)passes;
                    local_100f = (undefined1)(passes >> 8);
                    local_100e = (undefined1)(passes >> 0x10);
                    local_100d = (undefined1)(passes >> 0x18);
                    local_100c = 0;
                    local_1008 = (undefined1)flavour;
                    local_1007 = (undefined1)(flavour >> 8);
                    local_1006 = (undefined1)(flavour >> 0x10);
                    local_1005 = (undefined1)(flavour >> 0x18);
                    lVar9 = (uVar18 >> 7) + 1;
                    local_1004 = 0;
                    local_1000 = (undefined1)lVar9;
                    local_fff = (undefined1)((ulong)lVar9 >> 8);
                    local_ffe = (undefined1)((ulong)lVar9 >> 0x10);
                    local_ffd = (undefined1)((ulong)lVar9 >> 0x18);
                    local_ffc = (undefined1)((ulong)lVar9 >> 0x20);
                    local_ffb = (undefined1)((ulong)lVar9 >> 0x28);
                    local_ffa = (undefined1)((ulong)lVar9 >> 0x30);
                    local_ff9 = (undefined1)((ulong)lVar9 >> 0x38);
                    local_102f = (char)(uVar13 >> 8);
                    local_102e = (char)(uVar13 >> 0x10);
                    local_1027 = (char)(local_11d0 >> 8);
                    local_1026 = (char)(local_11d0 >> 0x10);
                    local_1017 = (char)(factor1 >> 8);
                    local_1016 = (char)(factor1 >> 0x10);
                    memset(local_430,0,0x400);
                    G_xor(local_430,local_430,&local_1030);
                    memset(local_c30,0,0x400);
                    G_xor((uint8_t *)local_c30,(uint8_t *)local_c30,local_430);
                  }
                  puVar8 = (uint *)((long)local_c30 +
                                   (ulong)((int)local_11b8 * 8 + (int)lVar14 & 0x3f8));
                }
                uVar11 = local_11d0;
                if (local_11b0 != 0 || uVar13 != 0) {
                  uVar11 = (ulong)puVar8[1] % (ulong)parallel;
                }
                uVar12 = (ulong)uVar20;
                if ((local_11d0 != (uVar11 & 0xffffffff)) && (uVar12 = uVar10, uVar18 == 0)) {
                  uVar12 = ((uVar10 & 0xffffffff) + (uVar1 - 1)) % uVar1;
                }
                auVar3._8_8_ = 0;
                auVar3._0_8_ = uVar1;
                auVar4._8_8_ = 0;
                auVar4._0_8_ = (uVar12 & 0xffffffff) + (uVar1 - uVar5);
                G_xor((uint8_t *)((long)__s + lVar16 * uVar17 * 0x400 + local_11d0 * 0x400),
                      (uint8_t *)
                      ((long)__s + (ulong)(uVar20 * parallel) * 0x400 + local_11d0 * 0x400),
                      (uint8_t *)
                      ((ulong)((int)((ulong)(~(uint)((SUB168(auVar4 % auVar3,0) & 0xffffffff) *
                                                     ((ulong)*puVar8 * (ulong)*puVar8 >> 0x20) >>
                                                    0x20) + SUB164(auVar4 % auVar3,0) + uVar5) %
                                    uVar1) * parallel + (int)uVar11) * 0x400 + (long)__s));
                uVar18 = uVar18 + 1;
                lVar14 = lVar14 + 8;
              } while (uVar18 < uVar2);
            }
            local_11d0 = local_11d0 + 1;
          } while (local_11d0 != uVar17);
        }
        local_11b0 = local_11b0 + 1;
        local_11b8 = 0;
        bVar6 = bVar21;
      } while (local_11b0 != 4);
      uVar13 = uVar13 + 1;
      local_11b8 = 0;
    } while (uVar13 != passes);
  }
  pvVar15 = (void *)((long)__s + (uVar1 - 1) * uVar17 * 0x400);
  memcpy(local_830,pvVar15,0x400);
  if (1 < parallel) {
    lVar14 = uVar17 - 1;
    lVar16 = 1;
    do {
      memxor(local_830,local_830,(uint8_t *)(lVar16 * 0x400 + (long)pvVar15),0x400);
      lVar16 = lVar16 + 1;
      lVar14 = lVar14 + -1;
    } while (lVar14 != 0);
  }
  psVar7 = hprime_new(taglen);
  BinarySink_put_data(psVar7->binarysink_,local_830,0x400);
  hprime_final(psVar7,taglen,vout);
  smemclr(local_c30,0x400);
  smemclr(local_430,0x400);
  smemclr(&local_1030,0x400);
  smemclr(local_830,0x400);
  smemclr(__s,factor1 * 0x400);
  safefree(__s);
  return;
}

Assistant:

void argon2(Argon2Flavour flavour, uint32_t mem, uint32_t passes,
            uint32_t parallel, uint32_t taglen,
            ptrlen P, ptrlen S, ptrlen K, ptrlen X, strbuf *out)
{
    argon2_internal(parallel, taglen, mem, passes, flavour,
                    P, S, K, X, strbuf_append(out, taglen));
}